

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Clasp::DimacsReader::parseAtLeastK(DimacsReader *this,WeightLitVec *scratch,int64_t maxV)

{
  bool bVar1;
  long in_RDX;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RSI;
  BufferedStream *in_RDI;
  WeightLitVec *unaff_retaddr;
  SatBuilder *in_stack_00000008;
  int64 lit;
  int64 k;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_stack_ffffffffffffffa8;
  undefined1 noSkipWs;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar2;
  int local_38;
  Literal local_34;
  pair<Clasp::Literal,_int> local_30;
  long local_28;
  long local_20;
  long local_18;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *local_10;
  BufferedStream *pBVar3;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pBVar3 = in_RDI;
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  clear(in_RSI);
  Potassco::ProgramReader::stream((ProgramReader *)in_RDI);
  bVar1 = Potassco::BufferedStream::match
                    (in_RDI,(int64_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                     ,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  uVar2 = false;
  if ((bVar1) && (uVar2 = false, -1 < local_20)) {
    uVar2 = local_20 < 0x80000000;
  }
  Potassco::ProgramReader::require
            ((ProgramReader *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0),(char *)0x1c6798);
  while( true ) {
    noSkipWs = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
    Potassco::ProgramReader::stream((ProgramReader *)in_RDI);
    bVar1 = Potassco::BufferedStream::match
                      (in_RDI,(int64_t *)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (bool)noSkipWs);
    in_stack_ffffffffffffffb7 = false;
    if ((bVar1) && (in_stack_ffffffffffffffb7 = false, -local_18 <= local_28)) {
      in_stack_ffffffffffffffb7 = local_28 <= local_18;
    }
    Potassco::ProgramReader::require
              ((ProgramReader *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               (bool)noSkipWs,(char *)0x1c6805);
    if (local_28 == 0) break;
    in_stack_ffffffffffffffa8 = local_10;
    local_34 = toLit(0x1c6841);
    local_38 = 1;
    std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_int,_true>(&local_30,&local_34,&local_38);
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               *)CONCAT17(uVar2,in_stack_ffffffffffffffc0),(pair<Clasp::Literal,_int> *)in_RDI);
  }
  SatBuilder::addConstraint(in_stack_00000008,unaff_retaddr,(weight_t)((ulong)pBVar3 >> 0x20));
  return;
}

Assistant:

void DimacsReader::parseAtLeastK(WeightLitVec& scratch, int64_t maxV) {
	scratch.clear();
	int64 k;
	require(stream()->match(k) && k >= 0 && k <= CLASP_WEIGHT_T_MAX, "invalid at-least-k constraint");
	for (int64 lit;;) {
		require(stream()->match(lit) && lit >= -maxV && lit <= maxV, "invalid variable in at-least-k constraint");
		if (lit == 0) {
			program_->addConstraint(scratch, static_cast<weight_t>(k));
			return;
		}
		scratch.push_back(WeightLiteral(toLit(static_cast<int32>(lit)), 1));
	}
}